

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
poly::
vector<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>>>,poly::delegate_cloning_policy<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>>>,std::integral_constant<bool,true>>>
::push_back_new_elem_w_storage_increase<Impl1,Impl1>
          (vector<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>>>,poly::delegate_cloning_policy<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>>>,std::integral_constant<bool,true>>>
           *this,Impl1 *param_2)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  code *pcVar4;
  void_pointer pvVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  vector<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>>>,poly::delegate_cloning_policy<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>>>,std::integral_constant<bool,true>>>
  *pvVar9;
  long lVar10;
  undefined8 uVar11;
  long v;
  ulong uVar12;
  undefined8 *puVar13;
  ulong uVar14;
  ulong uVar15;
  undefined8 *puVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  size_t a;
  undefined8 *puVar21;
  Impl1 *this_00;
  undefined1 local_79;
  allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>_>
  local_78;
  undefined8 *local_68;
  undefined8 *puStack_60;
  ulong local_58;
  undefined8 *local_48;
  Impl1 *local_40;
  vector<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>>>,poly::delegate_cloning_policy<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>>>,std::integral_constant<bool,true>>>
  *local_38;
  
  lVar10 = *(long *)this;
  lVar2 = *(long *)(this + 0x10);
  uVar20 = 1;
  if (0x27 < (ulong)(*(long *)(this + 0x18) - lVar10)) {
    uVar20 = (ulong)(*(long *)(this + 0x18) - lVar10) / 0x14 & 0xfffffffffffffffe;
  }
  uVar14 = 8;
  if (8 < *(ulong *)(this + 0x20)) {
    uVar14 = *(ulong *)(this + 0x20);
  }
  lVar1 = uVar14 - 1;
  uVar15 = (uVar14 - (uVar14 + 0x2f) % uVar14) + 0x2f;
  uVar18 = uVar14;
  lVar19 = lVar10;
  if (lVar10 == lVar2) {
    uVar17 = (lVar2 - lVar10 >> 3) * -0x3333333333333333;
    uVar12 = uVar15;
  }
  else {
    do {
      uVar12 = *(long *)(lVar19 + 0x18) + lVar1;
      uVar18 = (uVar18 - uVar12 % uVar14) + uVar12;
      lVar19 = lVar19 + 0x28;
    } while (lVar19 != lVar2);
    uVar17 = (lVar2 - lVar10 >> 3) * -0x3333333333333333;
    uVar12 = (uVar17 + uVar15 + uVar18) / (uVar17 + 1);
  }
  lVar10 = 0;
  if (uVar17 <= uVar20) {
    lVar10 = uVar20 - uVar17;
  }
  local_48 = (undefined8 *)(uVar20 * 0x28);
  local_68 = (undefined8 *)0x0;
  puStack_60 = (undefined8 *)0x0;
  local_78._storage = (undefined8 *)0x0;
  local_78._end_storage = (void_pointer)0x0;
  local_58 = 8;
  local_40 = param_2;
  vector_impl::
  allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>_>
  ::allocate(&local_78,uVar15 + (long)local_48 + uVar18 + lVar10 * uVar12);
  puVar21 = (undefined8 *)local_78._storage;
  local_68 = (undefined8 *)local_78._storage;
  puStack_60 = (undefined8 *)((long)local_78._storage + uVar20 * 5 * 8);
  puVar16 = *(undefined8 **)this;
  puVar3 = *(undefined8 **)(this + 0x10);
  local_58 = uVar14;
  local_38 = this;
  if (uVar20 != 0) {
    memset(local_78._storage,0,((uVar20 * 0x28 - 0x28) / 0x28) * 0x28 + 0x28);
  }
  puVar13 = (undefined8 *)((long)local_48 + (long)puVar21);
  local_48 = puVar13;
  if (puVar16 != puVar3) {
    do {
      pcVar4 = (code *)*puVar16;
      *puVar21 = pcVar4;
      uVar11 = puVar16[2];
      puVar21[2] = uVar11;
      uVar6 = *(undefined4 *)((long)puVar16 + 0x1c);
      uVar7 = *(undefined4 *)(puVar16 + 4);
      uVar8 = *(undefined4 *)((long)puVar16 + 0x24);
      *(undefined4 *)(puVar21 + 3) = *(undefined4 *)(puVar16 + 3);
      *(undefined4 *)((long)puVar21 + 0x1c) = uVar6;
      *(undefined4 *)(puVar21 + 4) = uVar7;
      *(undefined4 *)((long)puVar21 + 0x24) = uVar8;
      lVar10 = (lVar1 - (ulong)(lVar1 + (long)puVar13) % uVar14) + (long)puVar13;
      puVar21[1] = lVar10;
      uVar11 = (*pcVar4)(&local_79,uVar11,lVar10,1);
      puVar21[2] = uVar11;
      puVar13 = (undefined8 *)(puVar21[1] + puVar21[3]);
      puVar16 = puVar16 + 5;
      puVar21 = puVar21 + 5;
    } while (puVar16 != puVar3);
  }
  pvVar9 = local_38;
  puStack_60 = local_48;
  local_68 = puVar21;
  if ((puVar21 != local_48) && (7 < local_58)) {
    puVar16 = local_48;
    if (puVar21 != (undefined8 *)local_78._storage) {
      puVar16 = (undefined8 *)(puVar21[-4] + puVar21[-2]);
    }
    lVar10 = local_58 - ((long)puVar16 + (local_58 - 1)) % local_58;
    if ((void_pointer)((long)puVar16 + lVar10 + 0x2f) <= local_78._end_storage) {
      this_00 = (Impl1 *)(lVar10 + -1 + (long)puVar16);
      Impl1::Impl1(this_00,local_40);
      *local_68 = delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>
                  ::clone_func<Impl1>;
      local_68[1] = this_00;
      local_68[2] = this_00;
      local_68[3] = 0x30;
      local_68[4] = 8;
      puVar16 = *(undefined8 **)pvVar9;
      pvVar5 = *(void_pointer *)(pvVar9 + 8);
      *(undefined4 *)pvVar9 = local_78._storage._0_4_;
      *(undefined4 *)(pvVar9 + 4) = local_78._storage._4_4_;
      *(undefined4 *)(pvVar9 + 8) = local_78._end_storage._0_4_;
      *(undefined4 *)(pvVar9 + 0xc) = local_78._end_storage._4_4_;
      puVar3 = *(undefined8 **)(pvVar9 + 0x10);
      *(undefined8 **)(pvVar9 + 0x10) = local_68 + 5;
      lVar10 = *(long *)(pvVar9 + 0x18);
      *(undefined8 **)(pvVar9 + 0x18) = puStack_60;
      uVar11 = *(undefined8 *)(pvVar9 + 0x20);
      *(ulong *)(pvVar9 + 0x20) = local_58;
      local_78._storage = puVar16;
      local_78._end_storage = pvVar5;
      local_68 = puVar3;
      puStack_60 = (undefined8 *)lVar10;
      local_58 = uVar11;
      for (; puVar3 != puVar16; puVar16 = puVar16 + 5) {
        (**(code **)(*(long *)puVar16[2] + 0x18))();
        puVar16[2] = 0;
        puVar16[3] = 0;
        *puVar16 = 0;
        puVar16[1] = 0;
        puVar16[4] = 0;
      }
      local_58 = 8;
      puVar16 = (undefined8 *)local_78._storage;
      if (((ulong)((long)puStack_60 - (long)local_78._storage) / 5 & 0xfffffffffffffff8) * 5 != 0) {
        do {
          puVar16[3] = 0;
          puVar16[4] = 0;
          puVar16[1] = 0;
          puVar16[2] = 0;
          puVar16 = puVar16 + 5;
        } while (puVar16 !=
                 (undefined8 *)
                 ((long)local_78._storage +
                 ((ulong)((long)puStack_60 - (long)local_78._storage) / 0x28) * 5 * 8));
      }
      local_68 = (undefined8 *)0x0;
      puStack_60 = (undefined8 *)0x0;
      operator_delete(local_78._storage,(long)local_78._end_storage - (long)local_78._storage);
      local_78._storage = (void_pointer)0x0;
      local_78._end_storage = (void_pointer)0x0;
      operator_delete((void *)0x0,0);
      return;
    }
  }
  __assert_fail("can_construct_new_elem(s, a)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fecjanky[P]poly_vector/include/poly/vector.h"
                ,0x5a9,
                "void poly::vector<Interface, custom::Allocator<Interface, custom::AllocatorDescriptor<std::integral_constant<bool, false>, std::integral_constant<bool, true>, std::integral_constant<bool, true>, std::integral_constant<bool, false>, std::integral_constant<bool, true>>>>::push_back_new_elem(type_tag<T>, Args &&...) [IF = Interface, Allocator = custom::Allocator<Interface, custom::AllocatorDescriptor<std::integral_constant<bool, false>, std::integral_constant<bool, true>, std::integral_constant<bool, true>, std::integral_constant<bool, false>, std::integral_constant<bool, true>>>, CloningPolicy = poly::delegate_cloning_policy<Interface, custom::Allocator<Interface, custom::AllocatorDescriptor<std::integral_constant<bool, false>, std::integral_constant<bool, true>, std::integral_constant<bool, true>, std::integral_constant<bool, false>, std::integral_constant<bool, true>>>>, T = Impl1, Args = <Impl1>]"
               );
}

Assistant:

inline void vector<I, A, C>::push_back_new_elem_w_storage_increase(
    type_tag<T> /* t */, Args&&... args)
{
    constexpr auto s                = sizeof(T);
    constexpr auto a                = alignof(T);
    constexpr auto noexcept_movable = interface_type_noexcept_movable::value;
    constexpr auto nothrow_ctor     = std::is_nothrow_constructible<T, Args...>::value;
    //////////////////////////////////////////
    const auto new_capacity = std::max(capacity() * 2, size_t(1));
    const auto sizes        = calculate_storage_size(new_capacity, s, a);
    vector v(allocator_traits::select_on_container_copy_construction(base().get_allocator_ref()));
    v.init_layout(sizes.first, new_capacity, sizes.second);
    push_back_new_elem_w_storage_increase_copy(
        v, std::integral_constant < bool, noexcept_movable&& nothrow_ctor > {});
    v.push_back_new_elem(type_tag<T> {}, std::forward<Args>(args)...);
    this->swap(v);
}